

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

BayesianProbitRegressor * __thiscall
CoreML::Specification::Model::mutable_bayesianprobitregressor(Model *this)

{
  bool bVar1;
  BayesianProbitRegressor *this_00;
  Model *this_local;
  
  bVar1 = has_bayesianprobitregressor(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_bayesianprobitregressor(this);
    this_00 = (BayesianProbitRegressor *)operator_new(0x78);
    BayesianProbitRegressor::BayesianProbitRegressor(this_00);
    (this->Type_).bayesianprobitregressor_ = this_00;
  }
  return (BayesianProbitRegressor *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::BayesianProbitRegressor* Model::mutable_bayesianprobitregressor() {
  if (!has_bayesianprobitregressor()) {
    clear_Type();
    set_has_bayesianprobitregressor();
    Type_.bayesianprobitregressor_ = new ::CoreML::Specification::BayesianProbitRegressor;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.bayesianProbitRegressor)
  return Type_.bayesianprobitregressor_;
}